

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::updateRedundantRows
          (HighsDomain *this,HighsInt row,HighsInt direction,HighsInt numinf,HighsCDouble activity,
          double bound)

{
  int in_ECX;
  int in_EDX;
  int *in_XMM0_Qa;
  HighsCDouble *this_00;
  HighsHashTable<int,_void> *in_XMM1_Qa;
  HighsCDouble *in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  bool local_41;
  
  local_41 = true;
  if (in_ECX == 0) {
    ::operator*(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    this_00 = (HighsCDouble *)(double)in_EDX;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5c4a0a)
    ;
    local_41 = HighsCDouble::operator<=(this_00,(double)in_stack_ffffffffffffff98);
  }
  if (local_41 == false) {
    HighsHashTable<int,void>::insert<int&>(in_XMM1_Qa,in_XMM0_Qa);
  }
  return;
}

Assistant:

void HighsDomain::updateRedundantRows(HighsInt row, HighsInt direction,
                                      HighsInt numinf, HighsCDouble activity,
                                      double bound) {
  if (numinf != 0 || direction * activity <=
                         direction * bound + mipsolver->mipdata_->feastol) {
    // row that was found to be redundant should not be non-redundant
    assert(redundantRows_.find(row) == nullptr);
    return;
  }
  // row is redundant
  redundantRows_.insert(row);
}